

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O2

void __thiscall Test::HTMLOutput::generateHeader(HTMLOutput *this,ostream *stream,string *title)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,"<!DOCTYPE html>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"<html><head><title>");
  poVar1 = std::operator<<(poVar1,(string *)title);
  poVar1 = std::operator<<(poVar1,"</title>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "<meta http-equiv=\"content-type\" content=\"text/html; charset=utf-8\" />"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "<meta name=\"generator\" content=\"CppTest-lite - http://github.com/doe300/cpptest-lite\" />"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"<style type=\"text/css\">");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"td { vertical-align: super}");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,".message { display: block}");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"table { border: 1px solid grey; border-spacing: 0px}");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"td {border-top: 1px solid grey; padding: 2px}");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "td:not(:last-child), th:not(:last-child) {border-right: 1px solid grey}"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,".allPassed { background-color: green}");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,".mostPassed { background-color: yellow}");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,".manyPassed { background-color: orange}");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,".somePassed { background-color: orangered}");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,".fewPassed {background-color: red}");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"</style>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"</head>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void HTMLOutput::generateHeader(std::ostream &stream, const std::string &title) {
  stream << "<!DOCTYPE html>" << std::endl
         << "<html><head><title>" << title << "</title>" << std::endl
         << R"(<meta http-equiv="content-type" content="text/html; charset=utf-8" />)" << std::endl
         << R"(<meta name="generator" content="CppTest-lite - http://github.com/doe300/cpptest-lite" />)" << std::endl
         << R"(<style type="text/css">)" << std::endl
         << "td { vertical-align: super}" << std::endl
         << ".message { display: block}" << std::endl
         << "table { border: 1px solid grey; border-spacing: 0px}" << std::endl
         << "td {border-top: 1px solid grey; padding: 2px}" << std::endl
         << "td:not(:last-child), th:not(:last-child) {border-right: 1px solid grey}" << std::endl
         << ".allPassed { background-color: green}" << std::endl
         << ".mostPassed { background-color: yellow}" << std::endl
         << ".manyPassed { background-color: orange}" << std::endl
         << ".somePassed { background-color: orangered}" << std::endl
         << ".fewPassed {background-color: red}" << std::endl
         << "</style>" << std::endl
         << "</head>" << std::endl;
}